

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::BlockConnected
          (PeerManagerImpl *this,ChainstateRole role,shared_ptr<const_CBlock> *pblock,
          CBlockIndex *pindex)

{
  seconds t;
  Span<const_unsigned_char> vKey;
  Span<const_unsigned_char> vKey_00;
  string_view source_file;
  string_view logging_function;
  strong_ordering sVar1;
  bool bVar2;
  duration<long,_std::ratio<1L,_1L>_> dVar3;
  duration<long,_std::ratio<1L,_1L>_> dVar4;
  duration<long,_std::ratio<1L,_1L>_> *pdVar5;
  uchar *puVar6;
  CRollingBloomFilter *this_00;
  int in_ESI;
  size_t in_RDI;
  long in_FS_OFFSET;
  Level unaff_retaddr;
  long *in_stack_00000010;
  shared_ptr<const_CTransaction> *ptx;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  duration<long,_std::ratio<1L,_1L>_> new_timeout;
  duration<long,_std::ratio<1L,_1L>_> stalling_timeout;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock40;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  char *in_stack_fffffffffffffe60;
  Span<const_unsigned_char> *in_stack_fffffffffffffe68;
  duration<long,_std::ratio<1L,_1L>_> in_stack_fffffffffffffe70;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  duration<long,_std::ratio<1L,_1L>_> in_stack_fffffffffffffe88;
  AnnotatedMixin<std::mutex> *in_stack_fffffffffffffe90;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  undefined8 in_stack_fffffffffffffec8;
  int source_line;
  CBlock *in_stack_fffffffffffffef0;
  TxOrphanage *in_stack_fffffffffffffef8;
  ConstevalFormatString<1U> in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff18;
  Span<const_unsigned_char> local_78 [2];
  rep local_50;
  undefined8 local_48;
  rep_conflict local_40;
  rep local_38;
  rep local_30;
  undefined1 local_21;
  rep local_20;
  long local_8;
  
  source_line = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  dVar3 = GetTime<std::chrono::duration<long,std::ratio<1l,1l>>>();
  dVar4 = std::atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::operator=
                    ((atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                     in_stack_fffffffffffffe60,in_stack_fffffffffffffe70);
  local_20 = (rep)std::atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::load
                            (in_stack_fffffffffffffe88.__r,
                             (memory_order)((ulong)in_stack_fffffffffffffe80 >> 0x20));
  sVar1 = std::chrono::operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<1L,_1L>_>
                    ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffe70.__r,
                     (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffe68);
  std::__cmp_cat::__unspec::__unspec
            ((__unspec *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             (__unspec *)0x298569);
  local_21 = std::operator>=(sVar1._M_value);
  inline_assertion_check<false,bool>
            ((bool *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70.__r,
             (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),in_stack_fffffffffffffe60,
             (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  bVar2 = std::chrono::operator==
                    ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffe68,
                     (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffe60);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    local_48 = 0x3feb333333333333;
    local_40 = (rep_conflict)
               std::chrono::operator*
                         ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffe70.__r,
                          (double *)in_stack_fffffffffffffe68);
    local_38 = (rep)std::chrono::
                    duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,double,std::ratio<1l,1l>>
                              ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffe60);
    pdVar5 = std::max<std::chrono::duration<long,std::ratio<1l,1l>>>
                       ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffe68,
                        (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffe60);
    local_50 = pdVar5->__r;
    local_30 = local_50;
    bVar2 = std::atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::compare_exchange_strong
                      ((atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                       in_stack_fffffffffffffe78,
                       (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffe70.__r,
                       in_stack_fffffffffffffe88,
                       (memory_order)((ulong)in_stack_fffffffffffffe68 >> 0x20));
    if ((bVar2) &&
       (bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                                    Trace), bVar2)) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70.__r);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70.__r);
      in_stack_fffffffffffffe60 = "Decreased stalling timeout to %d seconds\n";
      t.__r._4_4_ = in_stack_fffffffffffffe5c;
      t.__r._0_4_ = in_stack_fffffffffffffe58;
      local_78[0].m_data = (uchar *)count_seconds(t);
      in_stack_fffffffffffffe68 = local_78;
      in_stack_fffffffffffffe58 = 1;
      logging_function._M_str = (char *)dVar3.__r;
      logging_function._M_len = dVar4.__r;
      source_file._M_str._0_7_ = in_stack_ffffffffffffff18;
      source_file._M_len = (size_t)in_stack_fffffffffffffe60;
      source_file._M_str._7_1_ = sVar1._M_value;
      LogPrintFormatInternal<long>
                (logging_function,source_file,source_line,
                 CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),unaff_retaddr,
                 in_stack_ffffffffffffff08,in_stack_00000010);
    }
  }
  if (in_ESI != 1) {
    MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
               (char *)in_stack_fffffffffffffe88.__r,in_stack_fffffffffffffe80,
               (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffe78 >> 0x18,0));
    puVar6 = (uchar *)(in_RDI + 0x460);
    std::__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffe68);
    TxOrphanage::EraseForBlock(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    std::__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_fffffffffffffe60);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)in_stack_fffffffffffffe60);
    while (bVar2 = __gnu_cxx::
                   operator==<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                               *)in_stack_fffffffffffffe68,
                              (__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                               *)in_stack_fffffffffffffe60), ((bVar2 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
      ::operator*((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      RecentConfirmedTransactionsFilter((PeerManagerImpl *)in_stack_fffffffffffffe60);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      CTransaction::GetHash
                ((CTransaction *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      this_00 = (CRollingBloomFilter *)
                transaction_identifier<false>::ToUint256
                          ((transaction_identifier<false> *)
                           CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      Span<const_unsigned_char>::Span<uint256>
                (in_stack_fffffffffffffe68,(uint256 *)in_stack_fffffffffffffe60,
                 (type)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      vKey.m_size = in_RDI;
      vKey.m_data = puVar6;
      CRollingBloomFilter::insert(this_00,vKey);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      bVar2 = CTransaction::HasWitness
                        ((CTransaction *)
                         CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      if (bVar2) {
        RecentConfirmedTransactionsFilter((PeerManagerImpl *)in_stack_fffffffffffffe60);
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        CTransaction::GetWitnessHash
                  ((CTransaction *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        transaction_identifier<true>::ToUint256
                  ((transaction_identifier<true> *)
                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        Span<const_unsigned_char>::Span<uint256>
                  (in_stack_fffffffffffffe68,(uint256 *)in_stack_fffffffffffffe60,
                   (type)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        vKey_00.m_size = in_RDI;
        vKey_00.m_data = puVar6;
        CRollingBloomFilter::insert(this_00,vKey_00);
      }
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      CTransaction::GetHash
                ((CTransaction *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      transaction_identifier::operator_cast_to_uint256_
                ((transaction_identifier<false> *)
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      TxRequestTracker::ForgetTxHash
                ((TxRequestTracker *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 (uint256 *)0x2989c2);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      CTransaction::GetWitnessHash
                ((CTransaction *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      transaction_identifier::operator_cast_to_uint256_
                ((transaction_identifier<true> *)
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      TxRequestTracker::ForgetTxHash
                ((TxRequestTracker *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 (uint256 *)0x298a13);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
      ::operator++((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    }
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::BlockConnected(
    ChainstateRole role,
    const std::shared_ptr<const CBlock>& pblock,
    const CBlockIndex* pindex)
{
    // Update this for all chainstate roles so that we don't mistakenly see peers
    // helping us do background IBD as having a stale tip.
    m_last_tip_update = GetTime<std::chrono::seconds>();

    // In case the dynamic timeout was doubled once or more, reduce it slowly back to its default value
    auto stalling_timeout = m_block_stalling_timeout.load();
    Assume(stalling_timeout >= BLOCK_STALLING_TIMEOUT_DEFAULT);
    if (stalling_timeout != BLOCK_STALLING_TIMEOUT_DEFAULT) {
        const auto new_timeout = std::max(std::chrono::duration_cast<std::chrono::seconds>(stalling_timeout * 0.85), BLOCK_STALLING_TIMEOUT_DEFAULT);
        if (m_block_stalling_timeout.compare_exchange_strong(stalling_timeout, new_timeout)) {
            LogDebug(BCLog::NET, "Decreased stalling timeout to %d seconds\n", count_seconds(new_timeout));
        }
    }

    // The following task can be skipped since we don't maintain a mempool for
    // the ibd/background chainstate.
    if (role == ChainstateRole::BACKGROUND) {
        return;
    }
    LOCK(m_tx_download_mutex);
    m_orphanage.EraseForBlock(*pblock);

    for (const auto& ptx : pblock->vtx) {
        RecentConfirmedTransactionsFilter().insert(ptx->GetHash().ToUint256());
        if (ptx->HasWitness()) {
            RecentConfirmedTransactionsFilter().insert(ptx->GetWitnessHash().ToUint256());
        }
        m_txrequest.ForgetTxHash(ptx->GetHash());
        m_txrequest.ForgetTxHash(ptx->GetWitnessHash());
    }
}